

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

Test * PlanTestPoolWithDepthOne::Create(void)

{
  StateTestWithBuiltinRules *this;
  
  this = (StateTestWithBuiltinRules *)operator_new(0x1c8);
  StateTestWithBuiltinRules::StateTestWithBuiltinRules(this);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PlanTest_001cf7b8;
  Plan::Plan((Plan *)(this + 1),(Builder *)0x0);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PlanTest_001cd4c0;
  g_current_test = (Test *)this;
  return &this->super_Test;
}

Assistant:

TEST_F(PlanTest, PoolWithDepthOne) {
  TestPoolWithDepthOne(
"pool foobar\n"
"  depth = 1\n"
"rule poolcat\n"
"  command = cat $in > $out\n"
"  pool = foobar\n"
"build out1: poolcat in\n"
"build out2: poolcat in\n");
}